

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O1

void __thiscall Potassco::SmodelsConvert::flushExternal(SmodelsConvert *this)

{
  Atom AVar1;
  SmData *pSVar2;
  pointer puVar3;
  Atom_t *pAVar4;
  iterator __position;
  Atom *pAVar5;
  Atom_t *pAVar6;
  Atom_t at;
  uint local_5c;
  uint *local_58;
  long local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_48 = 0;
  uStack_40 = 0;
  pSVar2 = this->data_;
  puVar3 = (pSVar2->head_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((pSVar2->head_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar3) {
    (pSVar2->head_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar3;
  }
  pAVar6 = (pSVar2->extern_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_start;
  pAVar4 = (pSVar2->extern_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (pAVar6 != pAVar4) {
    do {
      pAVar5 = SmData::mapAtom(this->data_,*pAVar6);
      AVar1 = *pAVar5;
      if (this->ext_ == false) {
        if (((uint)AVar1 >> 0x1c & 1) == 0) {
          local_5c = (uint)*pAVar5 & 0xfffffff;
          if ((uint)AVar1 >> 0x1e == 1) {
            local_50 = 1;
            local_58 = &local_5c;
            (*this->out_->_vptr_AbstractProgram[4])(this->out_,0,&local_58,&local_48);
          }
          else if ((uint)AVar1 >> 0x1e == 0) {
            pSVar2 = this->data_;
            __position._M_current =
                 (pSVar2->head_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (pSVar2->head_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)&pSVar2->head_,
                         __position,&local_5c);
            }
            else {
              *__position._M_current = local_5c;
              (pSVar2->head_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
          }
        }
      }
      else {
        (*this->out_->_vptr_AbstractProgram[9])(this->out_,(ulong)((uint)AVar1 & 0xfffffff));
      }
      pAVar6 = pAVar6 + 1;
    } while (pAVar6 != pAVar4);
  }
  local_58 = (this->data_->head_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
  puVar3 = (this->data_->head_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (local_58 != puVar3) {
    local_50 = (long)puVar3 - (long)local_58 >> 2;
    (*this->out_->_vptr_AbstractProgram[4])(this->out_,1,&local_58,&local_48);
  }
  return;
}

Assistant:

void SmodelsConvert::flushExternal() {
	LitSpan T = toSpan<Lit_t>();
	data_->head_.clear();
	for (SmData::AtomVec::const_iterator it = data_->extern_.begin(), end = data_->extern_.end(); it != end; ++it) {
		SmData::Atom& a = data_->mapAtom(*it);
		Value_t vt = static_cast<Value_t>(a.extn);
		if (!ext_) {
			if (a.head) { continue; }
			Atom_t at = a;
			if      (vt == Value_t::Free) { data_->head_.push_back(at); }
			else if (vt == Value_t::True) { out_.rule(Head_t::Disjunctive, toSpan(&at, 1), T); }
		}
		else {
			out_.external(a, vt);
		}
	}
	if (!data_->head_.empty()) {
		out_.rule(Head_t::Choice, toSpan(data_->head_), T);
	}
}